

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPUsesAllocatorsClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPUsesAllocatorsClause *this)

{
  bool bVar1;
  OpenMPUsesAllocatorsClauseAllocator OVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppuVar5;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  uint local_5c;
  string local_58 [4];
  uint i;
  string parameter_string;
  allocator<char> local_22;
  byte local_21;
  vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_> *local_20;
  vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
  *usesAllocatorsAllocatorSequence;
  OpenMPUsesAllocatorsClause *this_local;
  string *result;
  
  usesAllocatorsAllocatorSequence =
       (vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_> *)this;
  this_local = (OpenMPUsesAllocatorsClause *)__return_storage_ptr__;
  local_20 = getUsesAllocatorsAllocatorSequence(this);
  local_21 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"uses_allocators ",&local_22);
  std::allocator<char>::~allocator(&local_22);
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::operator+=(local_58,"(");
  for (local_5c = 0; uVar3 = (ulong)local_5c,
      sVar4 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::size
                        (local_20), uVar3 < sVar4; local_5c = local_5c + 1) {
    ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                        (local_20,(ulong)local_5c);
    OVar2 = usesAllocatorParameter::getUsesAllocatorsAllocator(*ppuVar5);
    switch(OVar2) {
    case OMPC_USESALLOCATORS_ALLOCATOR_default:
      std::__cxx11::string::operator+=(local_58,"omp_default_mem_alloc");
      ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (local_20,(ulong)local_5c);
      usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_80,*ppuVar5);
      bVar1 = std::operator!=(&local_80,"");
      std::__cxx11::string::~string((string *)&local_80);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_58,"(");
        ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(local_20,(ulong)local_5c);
        usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_a0,*ppuVar5);
        std::__cxx11::string::operator+=(local_58,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::operator+=(local_58,")");
      }
      uVar3 = (ulong)local_5c;
      sVar4 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::size
                        (local_20);
      if (uVar3 < sVar4 - 1) {
        std::__cxx11::string::operator+=(local_58,",");
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_large_cap:
      std::__cxx11::string::operator+=(local_58,"omp_large_cap_mem_alloc");
      ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (local_20,(ulong)local_5c);
      usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_c0,*ppuVar5);
      bVar1 = std::operator!=(&local_c0,"");
      std::__cxx11::string::~string((string *)&local_c0);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_58,"(");
        ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(local_20,(ulong)local_5c);
        usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_e0,*ppuVar5);
        std::__cxx11::string::operator+=(local_58,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::operator+=(local_58,")");
      }
      uVar3 = (ulong)local_5c;
      sVar4 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::size
                        (local_20);
      if (uVar3 < sVar4 - 1) {
        std::__cxx11::string::operator+=(local_58,",");
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_cons_mem:
      std::__cxx11::string::operator+=(local_58,"omp_const_mem_alloc");
      ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (local_20,(ulong)local_5c);
      usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_100,*ppuVar5);
      bVar1 = std::operator!=(&local_100,"");
      std::__cxx11::string::~string((string *)&local_100);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_58,"(");
        ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(local_20,(ulong)local_5c);
        usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_120,*ppuVar5);
        std::__cxx11::string::operator+=(local_58,(string *)&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::operator+=(local_58,")");
      }
      uVar3 = (ulong)local_5c;
      sVar4 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::size
                        (local_20);
      if (uVar3 < sVar4 - 1) {
        std::__cxx11::string::operator+=(local_58,",");
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_high_bw:
      std::__cxx11::string::operator+=(local_58,"omp_high_bw_mem_alloc");
      ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (local_20,(ulong)local_5c);
      usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_140,*ppuVar5);
      bVar1 = std::operator!=(&local_140,"");
      std::__cxx11::string::~string((string *)&local_140);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_58,"(");
        ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(local_20,(ulong)local_5c);
        usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_160,*ppuVar5);
        std::__cxx11::string::operator+=(local_58,(string *)&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::operator+=(local_58,")");
      }
      uVar3 = (ulong)local_5c;
      sVar4 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::size
                        (local_20);
      if (uVar3 < sVar4 - 1) {
        std::__cxx11::string::operator+=(local_58,",");
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_low_lat:
      std::__cxx11::string::operator+=(local_58,"omp_low_lat_mem_alloc");
      ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (local_20,(ulong)local_5c);
      usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_180,*ppuVar5);
      bVar1 = std::operator!=(&local_180,"");
      std::__cxx11::string::~string((string *)&local_180);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_58,"(");
        ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(local_20,(ulong)local_5c);
        usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_1a0,*ppuVar5);
        std::__cxx11::string::operator+=(local_58,(string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::operator+=(local_58,")");
      }
      uVar3 = (ulong)local_5c;
      sVar4 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::size
                        (local_20);
      if (uVar3 < sVar4 - 1) {
        std::__cxx11::string::operator+=(local_58,",");
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_cgroup:
      std::__cxx11::string::operator+=(local_58,"omp_cgroup_mem_alloc");
      ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (local_20,(ulong)local_5c);
      usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_1c0,*ppuVar5);
      bVar1 = std::operator!=(&local_1c0,"");
      std::__cxx11::string::~string((string *)&local_1c0);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_58,"(");
        ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(local_20,(ulong)local_5c);
        usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_1e0,*ppuVar5);
        std::__cxx11::string::operator+=(local_58,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::operator+=(local_58,")");
      }
      uVar3 = (ulong)local_5c;
      sVar4 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::size
                        (local_20);
      if (uVar3 < sVar4 - 1) {
        std::__cxx11::string::operator+=(local_58,",");
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_pteam:
      std::__cxx11::string::operator+=(local_58,"omp_pteam_mem_alloc");
      ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (local_20,(ulong)local_5c);
      usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_200,*ppuVar5);
      bVar1 = std::operator!=(&local_200,"");
      std::__cxx11::string::~string((string *)&local_200);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_58,"(");
        ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(local_20,(ulong)local_5c);
        usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_220,*ppuVar5);
        std::__cxx11::string::operator+=(local_58,(string *)&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::operator+=(local_58,")");
      }
      uVar3 = (ulong)local_5c;
      sVar4 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::size
                        (local_20);
      if (uVar3 < sVar4 - 1) {
        std::__cxx11::string::operator+=(local_58,",");
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_thread:
      std::__cxx11::string::operator+=(local_58,"omp_thread_mem_alloc");
      ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (local_20,(ulong)local_5c);
      usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_240,*ppuVar5);
      bVar1 = std::operator!=(&local_240,"");
      std::__cxx11::string::~string((string *)&local_240);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_58,"(");
        ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(local_20,(ulong)local_5c);
        usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_260,*ppuVar5);
        std::__cxx11::string::operator+=(local_58,(string *)&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::operator+=(local_58,")");
      }
      uVar3 = (ulong)local_5c;
      sVar4 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::size
                        (local_20);
      if (uVar3 < sVar4 - 1) {
        std::__cxx11::string::operator+=(local_58,",");
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_user:
      ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (local_20,(ulong)local_5c);
      usesAllocatorParameter::getAllocatorUser_abi_cxx11_(&local_280,*ppuVar5);
      std::__cxx11::string::operator+=(local_58,(string *)&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (local_20,(ulong)local_5c);
      usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_2a0,*ppuVar5);
      bVar1 = std::operator!=(&local_2a0,"");
      std::__cxx11::string::~string((string *)&local_2a0);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_58,"(");
        ppuVar5 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(local_20,(ulong)local_5c);
        usesAllocatorParameter::getAllocatorTraitsArray_abi_cxx11_(&local_2c0,*ppuVar5);
        std::__cxx11::string::operator+=(local_58,(string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::operator+=(local_58,")");
      }
      uVar3 = (ulong)local_5c;
      sVar4 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::size
                        (local_20);
      if (uVar3 < sVar4 - 1) {
        std::__cxx11::string::operator+=(local_58,",");
      }
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_58);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ) ");
  local_21 = 1;
  std::__cxx11::string::~string(local_58);
  if ((local_21 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPUsesAllocatorsClause::toString() {
    std::vector<usesAllocatorParameter*>* usesAllocatorsAllocatorSequence = this->getUsesAllocatorsAllocatorSequence();
    std::string result = "uses_allocators ";
    std::string parameter_string;
    parameter_string += "(";
    for (unsigned int i = 0; i < usesAllocatorsAllocatorSequence->size(); i++) {
        switch (usesAllocatorsAllocatorSequence->at(i)->getUsesAllocatorsAllocator()) {
            case OMPC_USESALLOCATORS_ALLOCATOR_default: {
                parameter_string += "omp_default_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_large_cap: {
                parameter_string += "omp_large_cap_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_cons_mem: {
                parameter_string += "omp_const_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_high_bw: {
                parameter_string += "omp_high_bw_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_low_lat: {
                parameter_string += "omp_low_lat_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_cgroup: {
                parameter_string += "omp_cgroup_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_pteam: {
                parameter_string += "omp_pteam_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_thread: {
                parameter_string += "omp_thread_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_user: {
                parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorUser();
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            default:
                   ;
    }
}
    result += parameter_string;
    result += " ) ";
    return result;
}